

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCodeMetadata
          (BinaryReaderIR *this,Offset offset,void *data,Address size)

{
  pointer *__ptr;
  _Elt_pointer pEVar1;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> local_48;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_;
  
  data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_initialize<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data_,data,size + (long)data);
  std::
  make_unique<wabt::CodeMetadataExpr,std::basic_string_view<char,std::char_traits<char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_string_view<char,_std::char_traits<char>_> *)local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->current_metadata_name_)
  ;
  local_48._M_head_impl = (CodeMetadataExpr *)local_40;
  (((ExprMixin<(wabt::ExprType)15> *)local_40)->super_Expr).loc.field_1.field_1.offset = offset;
  local_40 = (undefined1  [8])0x0;
  pEVar1 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar1 != (this->code_metadata_queue_).entries.
                super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pEVar1 == (this->code_metadata_queue_).entries.
                  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pEVar1 = (this->code_metadata_queue_).entries.
               super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
    }
    std::
    deque<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>,std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>>>
    ::
    emplace_back<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>>
              ((deque<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>,std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>>>
                *)&pEVar1[-1].func_queue,
               (unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *)
               &local_48);
    if (local_48._M_head_impl != (CodeMetadataExpr *)0x0) {
      (*((local_48._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr._vptr_Expr[1])();
    }
    local_48._M_head_impl = (CodeMetadataExpr *)0x0;
    if (local_40 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return (Result)Ok;
  }
  __assert_fail("!entries.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x3c,
                "void wabt::(anonymous namespace)::CodeMetadataExprQueue::push_metadata(std::unique_ptr<CodeMetadataExpr>)"
               );
}

Assistant:

Result BinaryReaderIR::OnCodeMetadata(Offset offset,
                                      const void* data,
                                      Address size) {
  std::vector<uint8_t> data_(static_cast<const uint8_t*>(data),
                             static_cast<const uint8_t*>(data) + size);
  auto meta = std::make_unique<CodeMetadataExpr>(current_metadata_name_,
                                                 std::move(data_));
  meta->loc.offset = offset;
  code_metadata_queue_.push_metadata(std::move(meta));
  return Result::Ok;
}